

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O0

int Abc_FrameReadMode(Abc_Frame_t *p)

{
  char *__nptr;
  char *pValue;
  int fShortNames;
  Abc_Frame_t *p_local;
  
  __nptr = Cmd_FlagReadByName(p,"namemode");
  if (__nptr == (char *)0x0) {
    pValue._4_4_ = 0;
  }
  else {
    pValue._4_4_ = atoi(__nptr);
  }
  return pValue._4_4_;
}

Assistant:

int Abc_FrameReadMode( Abc_Frame_t * p )
{
    int fShortNames;
    char * pValue;
    pValue = Cmd_FlagReadByName( p, "namemode" );
    if ( pValue == NULL )
        fShortNames = 0;
    else 
        fShortNames = atoi(pValue);
    return fShortNames;
}